

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

ostream * google::protobuf::operator<<(ostream *o,uint128 *b)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  uint128 dividend;
  char cVar4;
  ostream oVar5;
  ostream *poVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  uint128 divisor;
  uint128 divisor_00;
  string rep;
  uint128 mid;
  uint128 high;
  uint128 low;
  ostringstream os;
  long *local_1f8;
  ulong local_1f0;
  long local_1e8 [2];
  uint128 local_1d8;
  uint128 local_1c8;
  uint128 local_1b8;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  uVar2 = *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18);
  if ((uVar2 & 0x4a) == 8) {
    uVar7 = 0xf;
    uVar8 = 0x1000000000000000;
  }
  else if ((uVar2 & 0x4a) == 0x40) {
    uVar7 = 0x15;
    uVar8 = 0x8000000000000000;
  }
  else {
    uVar7 = 0x13;
    uVar8 = 10000000000000000000;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffbdb5 | uVar2 & 0x424a;
  local_1c8.lo_ = b->lo_;
  local_1c8.hi_ = b->hi_;
  local_1b8.lo_ = 0;
  local_1b8.hi_ = 0;
  divisor.hi_ = 0;
  divisor.lo_ = uVar8;
  uint128::DivModImpl(*b,divisor,&local_1c8,&local_1b8);
  local_1d8.lo_ = 0;
  local_1d8.hi_ = 0;
  dividend.hi_ = local_1c8.hi_;
  dividend.lo_ = local_1c8.lo_;
  divisor_00.hi_ = 0;
  divisor_00.lo_ = uVar8;
  uint128::DivModImpl(dividend,divisor_00,&local_1c8,&local_1d8);
  if (local_1c8.lo_ == 0) {
    if (local_1d8.lo_ == 0) goto LAB_002fc0fa;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    lVar3 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar3 + 1] == '\0') {
      cVar4 = std::ios::widen((char)&local_1f8 + (char)lVar3 + 'P');
      acStack_c8[lVar3] = cVar4;
      acStack_c8[lVar3 + 1] = '\x01';
    }
    acStack_c8[lVar3] = '0';
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar1 = *puVar1 & 0xfffffdff;
    lVar3 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar3 + 1] == '\0') {
      cVar4 = std::ios::widen((char)&local_1f8 + (char)lVar3 + 'P');
      acStack_c8[lVar3] = cVar4;
      acStack_c8[lVar3 + 1] = '\x01';
    }
    acStack_c8[lVar3] = '0';
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar7;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  }
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar7;
LAB_002fc0fa:
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  lVar3 = *(long *)o;
  lVar9 = *(long *)(lVar3 + -0x18);
  uVar8 = *(ulong *)(o + lVar9 + 0x10);
  *(undefined8 *)(o + lVar9 + 0x10) = 0;
  lVar9 = uVar8 - local_1f0;
  if (local_1f0 <= uVar8 && lVar9 != 0) {
    lVar3 = *(long *)(lVar3 + -0x18);
    poVar6 = o + lVar3;
    cVar4 = (char)lVar9;
    if ((uVar2 & 0xb0) == 0x20) {
      if (o[lVar3 + 0xe1] == (ostream)0x0) {
        oVar5 = (ostream)std::ios::widen((char)poVar6);
        poVar6[0xe0] = oVar5;
        poVar6[0xe1] = (ostream)0x1;
      }
      std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f0,0,cVar4);
    }
    else {
      if (o[lVar3 + 0xe1] == (ostream)0x0) {
        oVar5 = (ostream)std::ios::widen((char)poVar6);
        poVar6[0xe0] = oVar5;
        poVar6[0xe1] = (ostream)0x1;
      }
      std::__cxx11::string::insert((ulong)&local_1f8,0,cVar4);
    }
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_1f8,local_1f0);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return poVar6;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const uint128& b) {
  std::ios_base::fmtflags flags = o.flags();

  // Select a divisor which is the largest power of the base < 2^64.
  uint128 div;
  std::streamsize div_base_log;
  switch (flags & std::ios::basefield) {
    case std::ios::hex:
      div = static_cast<uint64>(GOOGLE_ULONGLONG(0x1000000000000000));  // 16^15
      div_base_log = 15;
      break;
    case std::ios::oct:
      div = static_cast<uint64>(GOOGLE_ULONGLONG(01000000000000000000000));  // 8^21
      div_base_log = 21;
      break;
    default:  // std::ios::dec
      div = static_cast<uint64>(GOOGLE_ULONGLONG(10000000000000000000));  // 10^19
      div_base_log = 19;
      break;
  }

  // Now piece together the uint128 representation from three chunks of
  // the original value, each less than "div" and therefore representable
  // as a uint64.
  std::ostringstream os;
  std::ios_base::fmtflags copy_mask =
      std::ios::basefield | std::ios::showbase | std::ios::uppercase;
  os.setf(flags & copy_mask, copy_mask);
  uint128 high = b;
  uint128 low;
  uint128::DivModImpl(high, div, &high, &low);
  uint128 mid;
  uint128::DivModImpl(high, div, &high, &mid);
  if (high.lo_ != 0) {
    os << high.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
    os << mid.lo_;
    os << std::setw(div_base_log);
  } else if (mid.lo_ != 0) {
    os << mid.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
  }
  os << low.lo_;
  std::string rep = os.str();

  // Add the requisite padding.
  std::streamsize width = o.width(0);
  if (width > rep.size()) {
    if ((flags & std::ios::adjustfield) == std::ios::left) {
      rep.append(width - rep.size(), o.fill());
    } else {
      rep.insert(static_cast<std::string::size_type>(0),
                 width - rep.size(), o.fill());
    }
  }

  // Stream the final representation in a single "<<" call.
  return o << rep;
}